

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

ssize_t __thiscall
booster::aio::stream_socket::readv(stream_socket *this,int __fd,iovec *__iovec,int __count)

{
  native_type __fd_00;
  long lVar1;
  ulong uVar2;
  int *piVar3;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  int *piVar4;
  long lVar5;
  bool bVar6;
  iovec vec [16];
  undefined8 uStack_130;
  iovec local_128 [16];
  
  piVar3 = (int *)CONCAT44(in_register_00000034,__fd);
  lVar5 = 0;
  if (*piVar3 == 0) {
    piVar4 = (int *)0x0;
    lVar1 = 0;
  }
  else if (*piVar3 == 1) {
    piVar4 = piVar3 + 2;
    lVar1 = 1;
  }
  else {
    piVar4 = *(int **)(piVar3 + 6);
    lVar1 = *(long *)(piVar3 + 8) - (long)piVar4 >> 4;
  }
  if (lVar1 != 0) {
    uVar2 = 0xf;
    if (lVar1 - 1U < 0xf) {
      uVar2 = lVar1 - 1U;
    }
    lVar1 = 8;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)local_128 + lVar1 + -8) = *(undefined8 *)((long)piVar4 + lVar1 + -8);
      *(undefined8 *)((long)&local_128[0].iov_base + lVar1) = *(undefined8 *)((long)piVar4 + lVar1);
      lVar5 = lVar5 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 + 1 != lVar5);
  }
  do {
    uStack_130 = 0x165d58;
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    uStack_130 = 0x165d65;
    uVar2 = ::readv(__fd_00,local_128,(int)lVar5);
    if ((int)uVar2 < 0) {
      uStack_130 = 0x165d76;
      piVar3 = __errno_location();
      bVar6 = *piVar3 == 4;
      uVar2 = uVar2 & 0xffffffff;
      if (bVar6) {
        uVar2 = unaff_RBP & 0xffffffff;
      }
    }
    else {
      bVar6 = false;
    }
    unaff_RBP = uVar2 & 0xffffffff;
  } while (bVar6);
  return unaff_RBP;
}

Assistant:

int stream_socket::readv(mutable_buffer const &b)
{
	static const unsigned max_vec_size = 16;
	mutable_buffer::buffer_data_type data = b.get();
	unsigned size=0;
#ifndef BOOSTER_WIN32
	struct iovec vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].iov_base = data.first[size].ptr;
		vec[size].iov_len = data.first[size].size;
	}
	for(;;) {
		int ret = ::readv(native(),vec,size);
		if(ret >= 0)
			return ret;
		if(ret < 0 && errno==EINTR)
			continue;
		return ret;
	}
#else // Win32
	WSABUF vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].buf = data.first[size].ptr;
		vec[size].len = data.first[size].size;
	}
	DWORD recved=0;
	DWORD flags=0;
	int res = ::WSARecv(native(),vec,size,&recved,&flags,0,0);
	if(res == 0)
		return recved;
	return -1;
#endif
}